

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Module.cpp
# Opt level: O2

WasmString * __thiscall
w3Module::read_string(WasmString *__return_storage_ptr__,w3Module *this,uint8_t **cursor)

{
  w3BuiltinString wVar1;
  uint32_t uVar2;
  int iVar3;
  uint8_t *puVar4;
  ulong uVar5;
  allocator<char> local_41;
  string local_40;
  
  uVar2 = read_varuint32(this,cursor);
  puVar4 = *cursor;
  uVar5 = (ulong)uVar2;
  if (this->end < puVar4 + uVar5) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"malformed in read_string",&local_41);
    ThrowString(&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    puVar4 = *cursor;
  }
  (__return_storage_ptr__->storage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->storage).field_2;
  (__return_storage_ptr__->storage)._M_string_length = 0;
  (__return_storage_ptr__->storage).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->builtin = w3BuiltinString_none;
  __return_storage_ptr__->builtinStorage = false;
  __return_storage_ptr__->data = (PCH)puVar4;
  __return_storage_ptr__->size = uVar5;
  if (-1 < (int)uVar2) {
    printf("read_string %X:%.*s\n",uVar5,uVar5);
  }
  puVar4 = *cursor;
  if (uVar5 == 5) {
    iVar3 = bcmp(puVar4,"_main",5);
    if (iVar3 != 0) goto LAB_00112540;
    wVar1 = w3BuiltinString_main;
  }
  else {
    if (uVar2 != 7) goto LAB_00112540;
    iVar3 = bcmp(puVar4,"$_start",7);
    if (iVar3 != 0) goto LAB_00112540;
    wVar1 = w3BuiltinString_start;
  }
  __return_storage_ptr__->builtin = wVar1;
LAB_00112540:
  *cursor = puVar4 + uVar5;
  return __return_storage_ptr__;
}

Assistant:

WasmString w3Module::read_string (uint8_t** cursor)
{
    const uint32_t size = read_varuint32 (cursor);
    if (size + *cursor > end)
        ThrowString ("malformed in read_string");
    // TODO UTF8 handling
    WasmString a;
    a.data = (PCH)*cursor;
    a.size = size;

    // TODO string recognizer?
    if (size <= INT_MAX)
        printf ("read_string %X:%.*s\n", size, (int)size, *cursor);
    if (size == 7 && !memcmp (*cursor, "$_start", 7))
    {
        a.builtin = w3BuiltinString_start;
    }
    else if (size == 5 && !memcmp (*cursor, "_main", 5))
    {
        a.builtin = w3BuiltinString_main;
    }
    *cursor += size;
    return a;
}